

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O3

boolean water_prayer(boolean bless_water)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  boolean bVar5;
  obj *poVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00227364;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0022735f;
LAB_0022738a:
    uVar7 = 0x40;
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) goto LAB_002273b7;
      bVar5 = dmgtype(youmonst.data,0x24);
      uVar7 = (uint)(bVar5 != '\0') << 6;
    }
  }
  else {
LAB_0022735f:
    if (ublindf != (obj *)0x0) {
LAB_00227364:
      if (ublindf->oartifact == '\x1d') goto LAB_0022738a;
    }
LAB_002273b7:
    uVar7 = 0;
  }
  poVar6 = level->objects[u.ux][u.uy];
  if (poVar6 == (obj *)0x0) {
    lVar9 = 0;
    bVar4 = false;
  }
  else {
    bVar4 = false;
    lVar9 = 0;
    do {
      if (poVar6->otyp == 0x14f) {
        uVar1 = *(uint *)&poVar6->field_0x4a;
        if (bless_water == '\0') {
          uVar2 = uVar1 & 1;
        }
        else {
          uVar2 = uVar1 & 2;
        }
        if (uVar2 != 0) goto LAB_0022742b;
        *(uint *)&poVar6->field_0x4a =
             uVar1 & 0xffffffbc | uVar7 | (bless_water * '\x02' & 2U | bless_water == '\0');
        lVar9 = lVar9 + poVar6->quan;
      }
      else {
LAB_0022742b:
        if (poVar6->oclass == '\b') {
          bVar4 = true;
        }
      }
      poVar6 = (poVar6->v).v_nexthere;
    } while (poVar6 != (obj *)0x0);
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00227460;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00227457;
  }
  else {
LAB_00227457:
    if (ublindf == (obj *)0x0) goto LAB_00227501;
LAB_00227460:
    if (ublindf->oartifact != '\x1d') goto LAB_00227501;
  }
  if (lVar9 != 0) {
    pcVar8 = "One of the";
    if (1 < lVar9) {
      pcVar8 = "Some of the";
    }
    pcVar10 = "";
    pcVar11 = "";
    if (lVar9 < 2) {
      pcVar10 = "s";
    }
    else {
      pcVar11 = "s";
    }
    pcVar3 = "The";
    if (bVar4) {
      pcVar11 = "s";
      pcVar3 = pcVar8;
    }
    pcVar8 = "light blue";
    if (bless_water == '\0') {
      pcVar8 = "black";
    }
    pcVar8 = hcolor(pcVar8);
    pline("%s potion%s on the altar glow%s %s for a moment.",pcVar3,pcVar11,pcVar10,pcVar8);
  }
LAB_00227501:
  return 0 < lVar9;
}

Assistant:

static boolean water_prayer(boolean bless_water)
{
    struct obj* otmp;
    long changed = 0;
    boolean other = FALSE, bc_known = !(Blind || Hallucination);

    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
	/* turn water into (un)holy water */
	if (otmp->otyp == POT_WATER &&
		(bless_water ? !otmp->blessed : !otmp->cursed)) {
	    otmp->blessed = bless_water;
	    otmp->cursed = !bless_water;
	    otmp->bknown = bc_known;
	    changed += otmp->quan;
	} else if (otmp->oclass == POTION_CLASS)
	    other = TRUE;
    }
    if (!Blind && changed) {
	pline("%s potion%s on the altar glow%s %s for a moment.",
	      ((other && changed > 1L) ? "Some of the" :
					(other ? "One of the" : "The")),
	      ((other || changed > 1L) ? "s" : ""), (changed > 1L ? "" : "s"),
	      (bless_water ? hcolor("light blue") : hcolor("black")));
    }
    return (boolean)(changed > 0L);
}